

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O0

String * __thiscall
asl::IniFile::operator[](String *__return_storage_ptr__,IniFile *this,String *name)

{
  bool bVar1;
  Map<asl::String,_asl::String> *pMVar2;
  String *pSVar3;
  String local_70;
  Map<asl::String,_asl::String> *local_58;
  Section *section;
  undefined1 local_40 [8];
  String sec;
  int slash;
  String *name_local;
  IniFile *this_local;
  
  sec.field_2._12_4_ = asl::String::indexOf(name,'/',0);
  if ((int)sec.field_2._12_4_ < 0) {
    pMVar2 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&this->_currentTitle)->
              super_Map<asl::String,_asl::String>;
    bVar1 = Map<asl::String,_asl::String>::has(pMVar2,name);
    if (bVar1) {
      pMVar2 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                          ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&this->_currentTitle)->
                super_Map<asl::String,_asl::String>;
      pSVar3 = Map<asl::String,_asl::String>::operator[](pMVar2,name);
      asl::String::String(__return_storage_ptr__,pSVar3);
    }
    else {
      asl::String::String(__return_storage_ptr__);
    }
  }
  else {
    asl::String::substring((String *)local_40,name,0,sec.field_2._12_4_);
    bVar1 = Map<asl::String,_asl::Dic<asl::String>_>::has
                      ((Map<asl::String,_asl::Dic<asl::String>_> *)this,(String *)local_40);
    if (bVar1) {
      local_58 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                            ((Map<asl::String,_asl::Dic<asl::String>_> *)this,(String *)local_40)->
                  super_Map<asl::String,_asl::String>;
      asl::String::substring(&local_70,name,sec.field_2._12_4_ + 1);
      asl::String::operator=((String *)local_40,&local_70);
      asl::String::~String(&local_70);
      bVar1 = Map<asl::String,_asl::String>::has(local_58,(String *)local_40);
      if (bVar1) {
        pSVar3 = Map<asl::String,_asl::String>::operator[](local_58,(String *)local_40);
        asl::String::String(__return_storage_ptr__,pSVar3);
      }
      else {
        asl::String::String(__return_storage_ptr__);
      }
    }
    else {
      asl::String::String(__return_storage_ptr__);
    }
    section._0_4_ = 1;
    asl::String::~String((String *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

const String IniFile::operator[](const String& name) const
{
	int slash = name.indexOf('/');
	if (slash < 0)
	{
		return _sections[_currentTitle].has(name) ? _sections[_currentTitle][name] : String();
	}
	else
	{
		String sec = name.substring(0, slash);
		if (!_sections.has(sec))
			return String();
		const Section& section = _sections[sec];
		sec = name.substring(slash + 1);
		return section.has(sec) ? section[sec] : String();
	}
}